

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TexelFetchDecodeSkippedcase::verifyResult
          (TexelFetchDecodeSkippedcase *this)

{
  ulong uVar1;
  ostringstream *poVar2;
  uint uVar3;
  TestLog *pTVar4;
  long lVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Vector<bool,_4> res_1;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  Vector<bool,_4> res;
  undefined8 local_208;
  long local_200;
  long local_1f8 [2];
  undefined1 local_1e8 [16];
  pointer local_1d8;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  Vec4 local_1a8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  pTVar4 = ((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = (pointer)0x0;
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1e8);
  dVar7 = glu::getInternalFormat((this->super_SRGBTestCase).m_internalFormat);
  _local_1c8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  if (dVar7 != 0x8fbd) {
    local_1b8 = ZEXT416(0x3e99999a);
    _local_1c8 = ZEXT416(0x3ecccccd);
  }
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Expected color: ","");
  local_1a8.m_data[0] = 0.2;
  local_1a8.m_data[1] = (float)local_1b8._0_4_;
  local_1a8.m_data[2] = (float)local_1c8._0_4_;
  local_1a8.m_data[3] = 1.0;
  SRGBTestCase::logColor
            ((SRGBTestCase *)((this->super_SRGBTestCase).super_TestCase.m_context)->m_testCtx->m_log
             ,(string *)local_198,0,&local_1a8);
  uVar6 = local_1c8._0_4_;
  fVar14 = 0.2;
  fVar15 = (float)local_1b8._0_4_;
  fVar16 = (float)local_1c8._0_4_;
  fVar17 = 1.0;
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    local_1c8._4_4_ = local_1b8._0_4_;
    local_1c8._0_4_ = 0x3e4ccccd;
    fStack_1c0 = (float)uVar6;
    fStack_1bc = 1.0;
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    fVar14 = (float)local_1c8._0_4_;
    fVar15 = (float)local_1c8._4_4_;
    fVar16 = fStack_1c0;
    fVar17 = fStack_1bc;
  }
  auVar12._0_4_ = *(float *)local_1e8._0_8_ - fVar14;
  auVar12._4_4_ = ((float *)local_1e8._0_8_)[1] - fVar15;
  auVar12._8_4_ = ((float *)local_1e8._0_8_)[2] - fVar16;
  auVar12._12_4_ = ((float *)local_1e8._0_8_)[3] - fVar17;
  uVar8 = CONCAT44(auVar12._4_4_,auVar12._0_4_);
  auVar11._0_8_ = uVar8 ^ 0x8000000080000000;
  auVar11._8_4_ = -auVar12._8_4_;
  auVar11._12_4_ = -auVar12._12_4_;
  auVar12 = maxps(auVar11,auVar12);
  auVar13._4_4_ = -(uint)(auVar12._4_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[1]);
  auVar13._0_4_ = -(uint)(auVar12._0_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[0]);
  auVar13._8_4_ = -(uint)(auVar12._8_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[2]);
  auVar13._12_4_ = -(uint)(auVar12._12_4_ < (this->super_SRGBTestCase).m_epsilonError.m_data[3]);
  auVar12 = packssdw(auVar13,auVar13);
  auVar12 = packsswb(auVar12,auVar12);
  local_198._0_8_ = pTVar4;
  if ((byte)(auVar12[0] & DAT_00967bd0) == 0) {
LAB_00459f28:
    auVar10._4_4_ = -(uint)(((float *)local_1e8._0_8_)[1] == fVar15);
    auVar10._0_4_ = -(uint)(*(float *)local_1e8._0_8_ == fVar14);
    auVar10._8_4_ = -(uint)(((float *)local_1e8._0_8_)[2] == fVar16);
    auVar10._12_4_ = -(uint)(((float *)local_1e8._0_8_)[3] == fVar17);
    auVar12 = packssdw(auVar10,auVar10);
    auVar12 = packsswb(auVar12,auVar12);
    uVar3 = auVar12._0_4_ & (uint)DAT_00967bd0;
    local_208 = (long *)CONCAT44((int)((ulong)local_208 >> 0x20),uVar3);
    if ((char)uVar3 != '\0') {
      uVar8 = 0xffffffffffffffff;
      do {
        if (uVar8 == 2) goto LAB_00459f7c;
        uVar1 = uVar8 + 1;
        lVar5 = uVar8 + 2;
        uVar8 = uVar1;
      } while (*(char *)((long)&local_208 + lVar5) != '\0');
      if (2 < uVar1) goto LAB_00459f7c;
    }
    poVar2 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"not linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_208,local_200);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_120);
    bVar9 = false;
  }
  else {
    uVar8 = 0xffffffffffffffff;
    do {
      if (uVar8 == 2) goto LAB_00459f7c;
      uVar1 = uVar8 + 1;
      lVar5 = uVar8 + 2;
      uVar8 = uVar1;
    } while (local_198[lVar5] != '\0');
    if (uVar1 < 3) goto LAB_00459f28;
LAB_00459f7c:
    poVar2 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    local_208 = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"linear as expected","");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_208,local_200);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_120);
    bVar9 = true;
  }
  if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 - local_1e8._0_8_);
  }
  return bVar9;
}

Assistant:

bool TexelFetchDecodeSkippedcase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;
	tcu::Vec4				pixelReference;
	tcu::Vec4				pixelExpected;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);

	pixelReference = pixelExpected = this->formatReferenceColor(getColorReferenceLinear());

	this->logColor(std::string("Expected color: "), resultColorIdx, pixelExpected);

	// result color 0 should be linear due to automatic conversion via texelFetch*(). Compare with linear reference color
	if ( (tcu::boolAll(tcu::lessThan(tcu::abs(pixelResultList[0] - pixelReference), m_epsilonError))) || (tcu::boolAll(tcu::equal(pixelResultList[0], pixelReference))) )
	{
		log << tcu::TestLog::Message << std::string("linear as expected") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("not linear as expected") << tcu::TestLog::EndMessage;
		return false;
	}
}